

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::not_connected_in_underlying_graph
          (Proof *this,vector<int,_std::allocator<int>_> *x,int y)

{
  long *plVar1;
  int *piVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  int *v;
  int *piVar6;
  long local_38;
  
  poVar4 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"u 1 ~x");
  local_38 = (long)y;
  pmVar5 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         binary_variable_mappings,&local_38);
  std::operator<<(poVar4,(string *)pmVar5);
  piVar2 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar6 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, piVar6 != piVar2; piVar6 = piVar6 + 1) {
    poVar4 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," 1 ~x");
    local_38 = (long)*piVar6;
    pmVar5 = std::
             map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->binary_variable_mappings,&local_38);
    std::operator<<(poVar4,(string *)pmVar5);
  }
  std::operator<<((ostream *)
                  uVar3._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl," >= 1 ;\n");
  plVar1 = &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

auto Proof::not_connected_in_underlying_graph(const std::vector<int> & x, int y) -> void
{
    *_imp->proof_stream << "u 1 ~x" << _imp->binary_variable_mappings[y];
    for (auto & v : x)
        *_imp->proof_stream << " 1 ~x" << _imp->binary_variable_mappings[v];
    *_imp->proof_stream << " >= 1 ;\n";
    ++_imp->proof_line;
}